

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

int Assimp::FBX::ParseTokenAsInt(Token *t,char **err_out)

{
  bool bVar1;
  TokenType TVar2;
  int iVar3;
  char *end;
  char *pcVar4;
  char *pcStack_38;
  int intval;
  char *out;
  char *pcStack_28;
  int32_t ival;
  char *data;
  char **err_out_local;
  Token *t_local;
  
  *err_out = (char *)0x0;
  data = (char *)err_out;
  err_out_local = &t->sbegin;
  TVar2 = Token::Type(t);
  if (TVar2 == TokenType_DATA) {
    bVar1 = Token::IsBinary((Token *)err_out_local);
    if (bVar1) {
      pcStack_28 = Token::begin((Token *)err_out_local);
      if (*pcStack_28 == 'I') {
        pcVar4 = pcStack_28 + 1;
        end = Token::end((Token *)err_out_local);
        t_local._4_4_ = anon_unknown.dwarf_c19d72::SafeParse<int>(pcVar4,end);
      }
      else {
        *(char **)data = "failed to parse I(nt), unexpected data type (binary)";
        t_local._4_4_ = 0;
      }
    }
    else {
      pcVar4 = Token::begin((Token *)err_out_local);
      iVar3 = strtol10(pcVar4,&stack0xffffffffffffffc8);
      pcVar4 = Token::end((Token *)err_out_local);
      t_local._4_4_ = iVar3;
      if (pcStack_38 != pcVar4) {
        *(char **)data = "failed to parse ID";
        t_local._4_4_ = 0;
      }
    }
  }
  else {
    *(char **)data = "expected TOK_DATA token";
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int ParseTokenAsInt(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'I') {
            err_out = "failed to parse I(nt), unexpected data type (binary)";
            return 0;
        }

        BE_NCONST int32_t ival = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(ival);
        return static_cast<int>(ival);
    }

    ai_assert(static_cast<size_t>(t.end() - t.begin()) > 0);

    const char* out;
    const int intval = strtol10(t.begin(),&out);
    if (out != t.end()) {
        err_out = "failed to parse ID";
        return 0;
    }

    return intval;
}